

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O0

InstanceNameSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::InstanceNameSyntax,slang::parsing::Token,slang::syntax::SyntaxList<slang::syntax::VariableDimensionSyntax>&>
          (BumpAllocator *this,Token *args,
          SyntaxList<slang::syntax::VariableDimensionSyntax> *args_1)

{
  Token name;
  InstanceNameSyntax *pIVar1;
  SyntaxList<slang::syntax::VariableDimensionSyntax> *in_RDX;
  InstanceNameSyntax *in_RSI;
  undefined8 in_RDI;
  Info *unaff_retaddr;
  size_t in_stack_ffffffffffffffd8;
  size_t in_stack_ffffffffffffffe0;
  
  pIVar1 = (InstanceNameSyntax *)
           allocate((BumpAllocator *)in_RDX,in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  name.info = unaff_retaddr;
  name.kind = (short)in_RDI;
  name._2_1_ = (char)((ulong)in_RDI >> 0x10);
  name.numFlags.raw = (char)((ulong)in_RDI >> 0x18);
  name.rawLen = (int)((ulong)in_RDI >> 0x20);
  slang::syntax::InstanceNameSyntax::InstanceNameSyntax(in_RSI,name,in_RDX);
  return pIVar1;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }